

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayout::setGeometry(QGridLayout *this,QRect *rect)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  QGridLayoutPrivate *this_00;
  QRect *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QLayout *unaff_retaddr;
  QGridLayoutPrivate *d;
  int in_stack_00000050;
  int in_stack_00000054;
  QGridLayoutPrivate *in_stack_00000058;
  QRect cr;
  undefined1 in_stack_00000080 [16];
  QRect *in_stack_ffffffffffffff78;
  QRect *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  bool local_59;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_2c;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  QRect *r;
  
  r = *(QRect **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGridLayout *)0x335795);
  bVar1 = QGridLayoutPrivate::isDirty(this_00);
  local_59 = true;
  if (!bVar1) {
    local_18 = (**(code **)(*in_RDI + 0x78))();
    local_59 = ::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if (local_59 != false) {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_2c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QLayoutItem::alignment((QLayoutItem *)in_stack_ffffffffffffff80);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    if (IVar2 == 0) {
      local_28 = *(undefined1 (*) [16])in_RSI;
    }
    else {
      local_28 = (undefined1  [16])QLayout::alignmentRect(unaff_retaddr,r);
    }
    iVar3 = horizontalSpacing((QGridLayout *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    verticalSpacing((QGridLayout *)CONCAT44(iVar3,in_stack_ffffffffffffff88));
    QGridLayoutPrivate::distribute
              (in_stack_00000058,(QRect)in_stack_00000080,in_stack_00000054,in_stack_00000050);
    QLayout::setGeometry((QLayout *)this_00,in_stack_ffffffffffffff78);
  }
  if (*(QRect **)(in_FS_OFFSET + 0x28) != r) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayout::setGeometry(const QRect &rect)
{
    Q_D(QGridLayout);
    if (d->isDirty() || rect != geometry()) {
        QRect cr = alignment() ? alignmentRect(rect) : rect;
        d->distribute(cr, horizontalSpacing(), verticalSpacing());
        QLayout::setGeometry(rect);
    }
}